

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O2

int BN_print(void *fp,BIGNUM *a)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int j;
  int iVar7;
  
  if (a->neg == 0) {
LAB_0016d651:
    iVar2 = BN_is_zero((BIGNUM *)a);
    if (iVar2 != 0) {
      iVar2 = BIO_write((BIO *)fp,"0",1);
      if (iVar2 != 1) goto LAB_0016d6d9;
    }
    uVar3 = bn_minimal_width((BIGNUM *)a);
    uVar6 = (ulong)uVar3;
    bVar1 = false;
    while (iVar2 = (int)uVar6, 0 < iVar2) {
      uVar6 = uVar6 - 1;
      for (iVar7 = 0x3c; -1 < iVar7; iVar7 = iVar7 + -4) {
        uVar5 = (ulong)((uint)(a->d[uVar6] >> ((byte)iVar7 & 0x3f)) & 0xf);
        if (bVar1) {
LAB_0016d6bf:
          bVar1 = true;
          iVar4 = BIO_write((BIO *)fp,"0123456789abcdef" + uVar5,1);
          if (iVar4 != 1) goto LAB_0016d6dd;
        }
        else {
          bVar1 = false;
          if (uVar5 != 0) goto LAB_0016d6bf;
        }
      }
    }
LAB_0016d6dd:
    uVar3 = (uint)(iVar2 < 1);
  }
  else {
    iVar2 = BIO_write((BIO *)fp,"-",1);
    if (iVar2 == 1) goto LAB_0016d651;
LAB_0016d6d9:
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

int BN_print(BIO *bp, const BIGNUM *a) {
  if (a->neg && BIO_write(bp, "-", 1) != 1) {
    return 0;
  }

  if (BN_is_zero(a) && BIO_write(bp, "0", 1) != 1) {
    return 0;
  }

  int z = 0;
  for (int i = bn_minimal_width(a) - 1; i >= 0; i--) {
    for (int j = BN_BITS2 - 4; j >= 0; j -= 4) {
      // strip leading zeros
      int v = ((int)(a->d[i] >> (long)j)) & 0x0f;
      if (z || v != 0) {
        if (BIO_write(bp, &hextable[v], 1) != 1) {
          return 0;
        }
        z = 1;
      }
    }
  }
  return 1;
}